

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O2

string * soul::CompileMessageHelpers::replaceArgument
                   (string *__return_storage_ptr__,string *text,size_t index,string *value)

{
  string_view firstReplacement;
  string_view firstReplacement_00;
  string_view firstToReplace;
  string_view firstToReplace_00;
  string i;
  _Alloc_hider in_stack_fffffffffffffed8;
  _Alloc_hider _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8 [32];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  
  std::__cxx11::to_string(&local_c8,index);
  std::__cxx11::string::string(local_48,(string *)text);
  std::operator+(&local_68,"$Q",&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed8,&local_68,"$");
  _Var1._M_p = in_stack_fffffffffffffed8._M_p;
  pbVar2 = in_stack_fffffffffffffee0;
  std::__cxx11::string::string((string *)&local_88,(string *)value);
  choc::text::addSingleQuotes(&local_e8,&local_88);
  firstReplacement._M_str = (char *)pbVar2;
  firstReplacement._M_len = (size_t)_Var1._M_p;
  firstToReplace._M_str = (char *)local_e8._M_string_length;
  firstToReplace._M_len = (size_t)in_stack_fffffffffffffed8._M_p;
  choc::text::replace<std::__cxx11::string>
            (&local_108,(text *)local_48,in_stack_fffffffffffffee0,firstToReplace,firstReplacement);
  std::__cxx11::string::operator=((string *)text,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::string(local_a8,(string *)text);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed8,"$",&local_c8);
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed8,"$");
  firstReplacement_00._M_str = (char *)pbVar2;
  firstReplacement_00._M_len = (size_t)_Var1._M_p;
  firstToReplace_00._M_str = (char *)value->_M_string_length;
  firstToReplace_00._M_len = (size_t)local_108._M_dataplus._M_p;
  choc::text::replace<std::__cxx11::string>
            (__return_storage_ptr__,(text *)local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_108._M_string_length,firstToReplace_00,firstReplacement_00);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

static std::string replaceArgument (std::string text, size_t index, const std::string& value)
    {
        auto i = std::to_string (index);
        text = choc::text::replace (text, "$Q" + i + "$", choc::text::addSingleQuotes (value));
        return choc::text::replace (text, "$" + i + "$", value);
    }